

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Header6::Header6
          (Header6 *this,ProtocolVersion PV,KUINT8 ExerciseID,PDUType PT,ProtocolFamily PF,
          TimeStamp *TS,KUINT16 PDULength)

{
  TimeStamp *TS_local;
  ProtocolFamily PF_local;
  PDUType PT_local;
  KUINT8 ExerciseID_local;
  ProtocolVersion PV_local;
  Header6 *this_local;
  
  this->_vptr_Header6 = (_func_int **)&PTR__Header6_0032ac58;
  this->m_ui8ProtocolVersion = (KUINT8)PV;
  this->m_ui8ExerciseID = ExerciseID;
  this->m_ui8PDUType = (KUINT8)PT;
  this->m_ui8ProtocolFamily = (KUINT8)PF;
  DATA_TYPE::TimeStamp::TimeStamp(&this->m_TimeStamp,TS);
  this->m_ui16PDULength = PDULength;
  this->m_ui8Padding1 = '\0';
  this->m_ui8Padding2 = '\0';
  return;
}

Assistant:

Header6::Header6( ProtocolVersion PV, KUINT8 ExerciseID, PDUType PT, ProtocolFamily PF, const TimeStamp & TS, KUINT16 PDULength ) :
    m_ui8ProtocolVersion( PV ),
    m_ui8ExerciseID( ExerciseID ),
    m_ui8PDUType( PT ),
    m_ui8ProtocolFamily( PF ),
    m_TimeStamp( TS ),
    m_ui16PDULength( PDULength ),
    m_ui8Padding1( 0 ),
    m_ui8Padding2( 0 )
{
}